

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::TagPOMCPPrior::ComputePreference(TagPOMCPPrior *this,State *state)

{
  BaseTag *pBVar1;
  char cVar2;
  undefined8 uVar3;
  Coord rob;
  value_type_conflict1 local_3c;
  undefined8 local_38;
  
  local_38 = BaseTag::GetRobPos(this->tag_model_,state);
  if (*(long *)&this->field_0x68 != *(long *)&this->field_0x60) {
    *(long *)&this->field_0x68 = *(long *)&this->field_0x60;
  }
  if (*(long *)&this->field_0x50 != *(long *)&this->field_0x48) {
    *(long *)&this->field_0x50 = *(long *)&this->field_0x48;
  }
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->field_0x60,&local_3c);
  }
  if (*(long *)&this->field_0x18 != *(long *)&this->field_0x10) {
    if (*(OBS_TYPE *)(*(long *)&this->field_0x30 + -8) == this->tag_model_->same_loc_obs_) {
      local_3c = 4;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&this->field_0x48,&local_3c);
    }
    else if (this->tag_model_->robot_pos_unknown_ == true) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        pBVar1 = this->tag_model_;
        uVar3 = despot::operator+((Coord *)&local_38,(Coord *)(&Compass::DIRECTIONS + local_3c));
        cVar2 = despot::Floor::Inside(&pBVar1->floor_,uVar3);
        if (cVar2 != '\0') {
          cVar2 = despot::Compass::Opposite(local_3c,*(int *)(*(long *)&this->field_0x18 + -4));
          if (cVar2 == '\0') {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&this->field_0x48,&local_3c);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		Coord rob = tag_model_->GetRobPos(&state);

		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 5; a++) {
			legal_actions_.push_back(a);
		}

		if (history_.Size() != 0) {
			if (history_.LastObservation() == tag_model_->same_loc_obs_) {
				preferred_actions_.push_back(tag_model_->TagAction());
			} else {
				if (tag_model_->robot_pos_unknown_) {
					for (int a = 0; a < 4; a++) {
						if (tag_model_->floor_.Inside(
							rob + Compass::DIRECTIONS[a])) {
							if (!Compass::Opposite(a, history_.LastAction()))
								preferred_actions_.push_back(a);
						}
					}
				}
			}
		}
	}